

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O0

void __thiscall IDisk::CleanDisk(IDisk *this)

{
  uint local_14;
  int side;
  IDisk *this_local;
  
  for (local_14 = 0; (int)local_14 < (int)(uint)this->nb_sides_; local_14 = local_14 + 1) {
    (*this->_vptr_IDisk[8])(this,(ulong)local_14);
  }
  this->disk_modified_ = false;
  this->side_[0].nb_tracks = 0;
  this->side_[0].tracks = (MFMTrack *)0x0;
  this->side_[1].nb_tracks = 0;
  this->side_[1].tracks = (MFMTrack *)0x0;
  this->nb_sides_ = '\0';
  return;
}

Assistant:

void IDisk::CleanDisk()
{
   //
   for (int side = 0; side < nb_sides_; side ++)
   {
      CleanSide(side);
   }
   disk_modified_ = false;

   side_[0].nb_tracks = 0;
   side_[0].tracks = nullptr;
   side_[1].nb_tracks = 0;
   side_[1].tracks = nullptr;
   nb_sides_ = 0;
}